

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O0

void __thiscall FlatLattice_GetTop_Test::TestBody(FlatLattice_GetTop_Test *this)

{
  bool bVar1;
  Element *pEVar2;
  char *pcVar3;
  int *piVar4;
  Flat<int> *in_RSI;
  Flat<int> *pFVar5;
  char *in_R9;
  string local_118;
  AssertHelper local_f8;
  Message local_f0;
  _Variadic_union<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top> local_e4;
  undefined1 local_e0;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_a8;
  Message local_a0;
  _Variadic_union<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top> local_94;
  undefined1 local_90;
  Flat<int> local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_58;
  Message local_50 [3];
  _Variadic_union<wasm::analysis::Flat<int>::Bot,_int,_wasm::analysis::Flat<int>::Top> local_34;
  undefined1 local_30;
  Flat<int> local_29;
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  Flat<int> flat;
  FlatLattice_GetTop_Test *this_local;
  
  pEVar2 = ::wasm::analysis::Flat<int>::getTop
                     ((Element *)
                      ((long)&gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 7),in_RSI);
  local_34 = SUB84(pEVar2,0);
  local_30 = (undefined1)((ulong)pEVar2 >> 0x20);
  bVar1 = ::wasm::analysis::Flat<int>::Element::isBottom((Element *)&local_34);
  local_29 = (Flat<int>)!bVar1;
  pFVar5 = &local_29;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_28,(bool *)pFVar5,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_28,
               (AssertionResult *)"flat.getTop().isBottom()","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x14c,pcVar3);
    pFVar5 = (Flat<int> *)local_50;
    testing::internal::AssertHelper::operator=(&local_58,(Message *)pFVar5);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  pEVar2 = ::wasm::analysis::Flat<int>::getTop
                     ((Element *)
                      ((long)&gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 7),pFVar5);
  local_94 = SUB84(pEVar2,0);
  local_90 = (undefined1)((ulong)pEVar2 >> 0x20);
  piVar4 = ::wasm::analysis::Flat<int>::Element::getVal((Element *)&local_94);
  local_89 = (Flat<int>)(piVar4 == (int *)0x0);
  pFVar5 = &local_89;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_88,(bool *)pFVar5,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_88,
               (AssertionResult *)"flat.getTop().getVal()","true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x14d,pcVar3);
    pFVar5 = (Flat<int> *)&local_a0;
    testing::internal::AssertHelper::operator=(&local_a8,(Message *)pFVar5);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  pEVar2 = ::wasm::analysis::Flat<int>::getTop
                     ((Element *)
                      ((long)&gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      + 7),pFVar5);
  local_e4 = SUB84(pEVar2,0);
  local_e0 = (undefined1)((ulong)pEVar2 >> 0x20);
  local_d9 = ::wasm::analysis::Flat<int>::Element::isTop((Element *)&local_e4);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d8,&local_d9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,(internal *)local_d8,(AssertionResult *)"flat.getTop().isTop()","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x14e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  return;
}

Assistant:

TEST(FlatLattice, GetTop) {
  analysis::Flat<int> flat;
  EXPECT_FALSE(flat.getTop().isBottom());
  EXPECT_FALSE(flat.getTop().getVal());
  EXPECT_TRUE(flat.getTop().isTop());
}